

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Document::ReadGlobalSettings(Document *this)

{
  bool bVar1;
  Element *pEVar2;
  Scope *pSVar3;
  FileGlobalSettings *pFVar4;
  shared_ptr<const_Assimp::FBX::PropertyTable> local_108;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  shared_ptr<const_Assimp::FBX::PropertyTable> props;
  shared_ptr<const_Assimp::FBX::PropertyTable> local_90;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  Element *local_20;
  Element *ehead;
  Scope *sc;
  Document *this_local;
  
  sc = (Scope *)this;
  pEVar2 = (Element *)Parser::GetRootScope(this->parser);
  ehead = pEVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"GlobalSettings",&local_41);
  pEVar2 = Scope::operator[]((Scope *)pEVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pEVar2;
  if ((pEVar2 != (Element *)0x0) && (pSVar3 = Element::Compound(pEVar2), pSVar3 != (Scope *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"",&local_c9);
    pEVar2 = local_20;
    pSVar3 = Element::Compound(local_20);
    Util::GetPropertyTable((Util *)local_a8,this,&local_c8,pEVar2,pSVar3,true);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a8);
    if (bVar1) {
      pFVar4 = (FileGlobalSettings *)operator_new(0x18);
      std::shared_ptr<const_Assimp::FBX::PropertyTable>::shared_ptr
                (&local_108,(shared_ptr<const_Assimp::FBX::PropertyTable> *)local_a8);
      FileGlobalSettings::FileGlobalSettings(pFVar4,this,&local_108);
      std::
      unique_ptr<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
      ::reset(&this->globals,pFVar4);
      std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(&local_108);
      std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr
                ((shared_ptr<const_Assimp::FBX::PropertyTable> *)local_a8);
      return;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_f0,"GlobalSettings dictionary contains no property table",&local_f1)
    ;
    Util::DOMError(&local_f0,(Element *)0x0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"no GlobalSettings dictionary found",&local_79);
  Util::DOMWarning(&local_78,(Element *)0x0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pFVar4 = (FileGlobalSettings *)operator_new(0x18);
  props.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._7_1_ = 1;
  std::make_shared<Assimp::FBX::PropertyTable_const>();
  FileGlobalSettings::FileGlobalSettings(pFVar4,this,&local_90);
  props.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._7_1_ = 0;
  std::
  unique_ptr<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
  ::reset(&this->globals,pFVar4);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(&local_90);
  return;
}

Assistant:

void Document::ReadGlobalSettings()
{
    const Scope& sc = parser.GetRootScope();
    const Element* const ehead = sc["GlobalSettings"];
    if ( nullptr == ehead || !ehead->Compound() ) {
        DOMWarning( "no GlobalSettings dictionary found" );
        globals.reset(new FileGlobalSettings(*this, std::make_shared<const PropertyTable>()));
        return;
    }

    std::shared_ptr<const PropertyTable> props = GetPropertyTable( *this, "", *ehead, *ehead->Compound(), true );

    //double v = PropertyGet<float>( *props.get(), std::string("UnitScaleFactor"), 1.0 );

    if(!props) {
        DOMError("GlobalSettings dictionary contains no property table");
    }

    globals.reset(new FileGlobalSettings(*this, props));
}